

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

Object * resolveCall(Object *__return_storage_ptr__,Call c,Environment *env)

{
  char *identifer;
  Object value;
  int iVar1;
  Object *pOVar2;
  Environment *env_00;
  long lVar3;
  Container r;
  Object callee;
  Container local_120;
  Object local_f0;
  Object local_b0;
  Object local_70;
  
  iVar1 = strcmp(c.identifer,"Main");
  if (iVar1 == 0) {
    pOVar2 = resolveRoutineCall(__return_storage_ptr__,c,env);
    return pOVar2;
  }
  env_get(&local_b0,c.identifer,c.line,env);
  if (local_b0.type == OBJECT_ROUTINE) {
    pOVar2 = resolveRoutineCall(__return_storage_ptr__,c,env);
  }
  else {
    env_container_get(&local_120,c.identifer,c.line,globalEnv);
    if (local_120.arity != c.argCount) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Argument count mismatch for container %s! Expected : %d Received %d!\x1b[0m"
             ,(ulong)(uint)c.line,c.identifer,(ulong)(uint)local_120.arity,(ulong)(uint)c.argCount);
      putchar(10);
      unload_all();
      exit(1);
    }
    env_00 = env_new(globalEnv);
    if (0 < local_120.arity) {
      lVar3 = 0;
      do {
        identifer = local_120.arguments[lVar3];
        resolveExpression(&local_f0,c.arguments[lVar3],env);
        value.field_1.instance = local_f0.field_1.instance;
        value.type = local_f0.type;
        value._4_4_ = local_f0._4_4_;
        value.field_1._8_8_ = local_f0.field_1._8_8_;
        value.field_1._16_8_ = local_f0.field_1._16_8_;
        value.field_1.routine.arguments = local_f0.field_1.routine.arguments;
        value.field_1._32_8_ = local_f0.field_1._32_8_;
        value.field_1.container.constructor.statements =
             local_f0.field_1.container.constructor.statements;
        value.field_1.routine.code.statements = local_f0.field_1.routine.code.statements;
        env_put(identifer,c.line,value,env_00);
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_120.arity);
    }
    executeBlock(&local_70,local_120.constructor,env_00);
    __return_storage_ptr__->type = OBJECT_INSTANCE;
    pOVar2 = (Object *)malloc(0x20);
    (__return_storage_ptr__->field_1).instance = (Instance *)pOVar2;
    (pOVar2->field_1).instance = (Instance *)local_120.name;
    *(Environment **)((long)&pOVar2->field_1 + 0x10) = env_00;
    pOVar2->type = OBJECT_NULL;
    instanceCount = instanceCount + 1;
    *(int *)((long)&pOVar2->field_1 + 0xc) = instanceCount;
    *(undefined4 *)((long)&pOVar2->field_1 + 8) = 0;
  }
  return pOVar2;
}

Assistant:

static Object resolveCall(Call c, Environment *env){
    if(strcmp(c.identifer, "Main") == 0)
        return resolveRoutineCall(c, env);

    Object callee = env_get(c.identifer, c.line, env);
    if(callee.type == OBJECT_ROUTINE)
        return resolveRoutineCall(c, env);
    else
        return resolveContainerCall(c, env);
}